

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textreader.hpp
# Opt level: O0

void __thiscall TextReader::read_eol(TextReader *this)

{
  bool bVar1;
  allocator local_31;
  string local_30 [32];
  TextReader *local_10;
  TextReader *this_local;
  
  local_10 = this;
  bVar1 = is_eol(this);
  if (bVar1) {
    skip_line(this);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,"Expect end of the line",&local_31);
    parse_error(this,(string *)local_30);
    std::__cxx11::string::~string(local_30);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
  }
  return;
}

Assistant:

inline void skip_space() {
        while (current_token_pos_ < current_line_.size()) {
            if (current_line_[current_token_pos_] != ' ')
                break;
            current_token_pos_++;
            if (current_token_len_ > 0) {
                reset_token();
            };
        };
    }